

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo3.cpp
# Opt level: O0

int64_t primecount::pi_lmo3(int64_t x)

{
  undefined1 x_00 [16];
  size_t sVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  long in_RDI;
  Vector<int,_std::allocator<int>_> *in_stack_00000030;
  Vector<int,_std::allocator<int>_> *in_stack_00000038;
  int64_t in_stack_00000040;
  int64_t in_stack_00000048;
  int64_t in_stack_00000050;
  int64_t in_stack_00000058;
  int64_t sum;
  int64_t phi;
  int64_t s2;
  int64_t s1;
  int64_t p2;
  int64_t pi_y;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  type primes;
  int64_t c;
  int64_t y;
  int64_t x13;
  double alpha;
  int threads;
  uint64_t in_stack_fffffffffffffec8;
  long in_stack_fffffffffffffee0;
  Vector<int,_std::allocator<int>_> *this;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 is_print;
  int in_stack_ffffffffffffff2c;
  int64_t in_stack_ffffffffffffff30;
  int64_t in_stack_ffffffffffffff38;
  int64_t in_stack_ffffffffffffff40;
  Vector<int,_std::allocator<int>_> local_68;
  uint64_t local_50;
  Vector<int,_std::allocator<int>_> *local_48;
  long local_40;
  long local_30;
  double local_20;
  undefined4 local_14;
  long local_8;
  
  if (in_RDI < 2) {
    local_8 = 0;
  }
  else {
    local_14 = 1;
    local_30 = in_RDI >> 0x3f;
    x_00._4_4_ = in_stack_ffffffffffffff24;
    x_00._0_4_ = in_stack_ffffffffffffff20;
    x_00._8_4_ = in_stack_ffffffffffffff28;
    x_00._12_4_ = in_stack_ffffffffffffff2c;
    local_20 = get_alpha_lmo((maxint_t)x_00);
    local_40 = (anonymous_namespace)::iroot<3,long>(in_stack_fffffffffffffee0);
    local_48 = (Vector<int,_std::allocator<int>_> *)(long)((double)local_40 * local_20);
    local_50 = PhiTiny::get_c(in_stack_fffffffffffffec8);
    generate_primes<int>(in_stack_fffffffffffffec8);
    generate_lpf(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    generate_moebius(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    is_print = (undefined1)((uint)in_stack_ffffffffffffff28 >> 0x18);
    sVar1 = Vector<int,_std::allocator<int>_>::size(&local_68);
    primecount::is_print();
    iVar2 = P2(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c,(bool)is_print);
    this = local_48;
    primecount::is_print();
    iVar3 = S1(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c,(bool)is_print);
    iVar4 = anon_unknown.dwarf_6fbb5::S2
                      (in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                       in_stack_00000038,in_stack_00000030,
                       (Vector<int,_std::allocator<int>_> *)primes.array_);
    local_8 = (iVar3 + iVar4 + sVar1 + -2) - iVar2;
    Vector<int,_std::allocator<int>_>::~Vector(this);
    Vector<int,_std::allocator<int>_>::~Vector(this);
    Vector<int,_std::allocator<int>_>::~Vector(this);
  }
  return local_8;
}

Assistant:

int64_t pi_lmo3(int64_t x)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads);
  int64_t s2 = S2(x, y, c, pi_y, primes, lpf, mu);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}